

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functional.hpp
# Opt level: O0

bool __thiscall
trial::online::detail::close_to<double>::operator()(close_to<double> *this,double *lhs,double *rhs)

{
  double dVar1;
  double *pdVar2;
  int __x;
  double extraout_XMM0_Qa;
  double local_38;
  double local_30;
  double local_28;
  double *local_20;
  double *rhs_local;
  double *lhs_local;
  close_to<double> *this_local;
  close_to<double> *pcVar3;
  
  pcVar3 = this;
  local_20 = rhs;
  rhs_local = lhs;
  lhs_local = &this->relative;
  std::abs((int)this);
  __x = (int)pcVar3;
  dVar1 = this->relative;
  std::abs(__x);
  std::abs(__x);
  pdVar2 = std::max<double>(&local_30,&local_38);
  local_28 = dVar1 * *pdVar2;
  pdVar2 = std::max<double>(&local_28,&this->absolute);
  return extraout_XMM0_Qa < *pdVar2;
}

Assistant:

constexpr bool operator() (const T& lhs, const T& rhs) const noexcept
    {
        return std::abs(lhs - rhs) < std::max(relative * std::max(std::abs(lhs), std::abs(rhs)), absolute);
    }